

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int send_certificate_and_certificate_verify
              (ptls_t *tls,ptls_message_emitter_t *emitter,
              st_ptls_signature_algorithms_t *signature_algorithms,ptls_iovec_t context,
              char *context_string,int push_status_request,uint16_t *compress_algos,
              size_t num_compress_algos)

{
  code *pcVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  ptls_message_emitter_t *ppVar5;
  int iVar6;
  size_t len;
  ulong body_size_00;
  ptls_iovec_t pVar7;
  ptls_message_emitter_t *local_1c8;
  size_t body_size;
  size_t body_size_1;
  size_t local_1a8;
  size_t datalen;
  uint8_t data [226];
  uint16_t algo;
  size_t body_start_1;
  size_t capacity_1;
  size_t sStack_98;
  uint16_t _v;
  size_t algo_off;
  ptls_buffer_t *sendbuf;
  size_t body_start;
  size_t capacity;
  size_t local_70;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  ptls_emit_certificate_t *emit_certificate;
  char *pcStack_40;
  int ret;
  char *context_string_local;
  st_ptls_signature_algorithms_t *signature_algorithms_local;
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t context_local;
  
  context_local.base = (uint8_t *)context.len;
  tls_local = (ptls_t *)context.base;
  if (signature_algorithms->count == 0) {
    emit_certificate._4_4_ = 0x6d;
    iVar6 = emit_certificate._4_4_;
  }
  else {
    if (tls->ctx->emit_certificate == (ptls_emit_certificate_t *)0x0) {
      local_1c8 = (ptls_message_emitter_t *)
                  &send_certificate_and_certificate_verify::default_emit_certificate;
    }
    else {
      local_1c8 = (ptls_message_emitter_t *)tls->ctx->emit_certificate;
    }
    _emitter = local_1c8;
    pcStack_40 = context_string;
    context_string_local = (char *)signature_algorithms;
    signature_algorithms_local = (st_ptls_signature_algorithms_t *)emitter;
    emitter_local = (ptls_message_emitter_t *)tls;
    while (emit_certificate._4_4_ =
                (*(code *)_emitter->buf)
                          (_emitter,emitter_local,signature_algorithms_local,emitter_local[2].buf,
                           tls_local,context_local.base,push_status_request,compress_algos,
                           num_compress_algos), emit_certificate._4_4_ != 0) {
      if (emit_certificate._4_4_ != 0x20a) {
        return emit_certificate._4_4_;
      }
      if (_emitter ==
          (ptls_message_emitter_t *)
          &send_certificate_and_certificate_verify::default_emit_certificate) {
        __assert_fail("emit_certificate != &default_emit_certificate",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/t/../lib/picotls.c"
                      ,0xa41,
                      "int send_certificate_and_certificate_verify(ptls_t *, ptls_message_emitter_t *, struct st_ptls_signature_algorithms_t *, ptls_iovec_t, const char *, int, const uint16_t *, size_t)"
                     );
      }
      _emitter = (ptls_message_emitter_t *)
                 &send_certificate_and_certificate_verify::default_emit_certificate;
      emit_certificate._4_4_ = 0x20a;
    }
    iVar6 = 0;
    if (emitter_local->buf[2].capacity != 0) {
      _buf = (ptls_buffer_t *)signature_algorithms_local;
      emit_certificate._4_4_ =
           (**(code **)(signature_algorithms_local->list + 0xc))(signature_algorithms_local);
      iVar6 = emit_certificate._4_4_;
      if (emit_certificate._4_4_ == 0) {
        _key_sched = (ptls_key_schedule_t *)_buf->base;
        mess_start = (size_t)emitter_local[2].buf;
        local_70 = *(size_t *)_key_sched->secret;
        capacity._7_1_ = 0xf;
        emit_certificate._4_4_ =
             ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
        iVar6 = emit_certificate._4_4_;
        if (emit_certificate._4_4_ == 0) {
          body_start = 3;
          emit_certificate._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
          iVar6 = emit_certificate._4_4_;
          if (emit_certificate._4_4_ == 0) {
            sendbuf = *(ptls_buffer_t **)_key_sched->secret;
            algo_off = *(size_t *)signature_algorithms_local->list;
            sStack_98 = ((ptls_buffer_t *)algo_off)->off;
            capacity_1._6_2_ = 0;
            capacity_1._4_1_ = 0;
            capacity_1._5_1_ = 0;
            emit_certificate._4_4_ =
                 ptls_buffer__do_pushv((ptls_buffer_t *)algo_off,(void *)((long)&capacity_1 + 4),2);
            iVar6 = emit_certificate._4_4_;
            if (emit_certificate._4_4_ == 0) {
              body_start_1 = 2;
              emit_certificate._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)algo_off,"",2);
              iVar6 = emit_certificate._4_4_;
              if (emit_certificate._4_4_ == 0) {
                unique0x00012000 = *(long *)(algo_off + 0x10);
                len = build_certificate_verify_signdata
                                ((uint8_t *)&datalen,(ptls_key_schedule_t *)emitter_local[2].buf,
                                 pcStack_40);
                ppVar5 = emitter_local;
                sVar4 = algo_off;
                pcVar1 = *(code **)emitter_local->buf[2].capacity;
                sVar2 = emitter_local->buf[2].capacity;
                pVar7 = ptls_iovec_init(&datalen,len);
                body_size_1 = (size_t)pVar7.base;
                local_1a8 = pVar7.len;
                emit_certificate._4_4_ =
                     (*pcVar1)(sVar2,ppVar5,data + 0xde,sVar4,body_size_1,local_1a8,
                               context_string_local,*(undefined8 *)(context_string_local + 0x20));
                iVar6 = emit_certificate._4_4_;
                if (emit_certificate._4_4_ == 0) {
                  *(uint8_t *)(*(long *)algo_off + sStack_98) = SUB21(data._222_2_,1);
                  *(uint8_t *)(*(long *)algo_off + 1 + sStack_98) = (uint8_t)data._222_2_;
                  lVar3 = *(long *)(algo_off + 0x10);
                  for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                    *(char *)(*(long *)algo_off + (stack0xffffffffffffff50 - body_start_1)) =
                         (char)((ulong)(lVar3 - stack0xffffffffffffff50) >>
                               (((char)body_start_1 + -1) * '\b' & 0x3fU));
                  }
                  body_size_00 = *(long *)_key_sched->secret - (long)sendbuf;
                  if (body_start == 0xffffffffffffffff) {
                    iVar6 = ptls_buffer__adjust_quic_blocksize
                                      ((ptls_buffer_t *)_key_sched,body_size_00);
                    if (iVar6 != 0) {
                      return iVar6;
                    }
                  }
                  else {
                    for (; body_start != 0; body_start = body_start - 1) {
                      *(char *)((long)sendbuf + (*(long *)_key_sched - body_start)) =
                           (char)(body_size_00 >> (((char)body_start + -1) * '\b' & 0x3fU));
                    }
                  }
                  emit_certificate._4_4_ = 0;
                  if (mess_start != 0) {
                    ptls__key_schedule_update_hash
                              ((ptls_key_schedule_t *)mess_start,
                               (uint8_t *)(*(long *)_key_sched + local_70),
                               *(long *)_key_sched->secret - local_70);
                  }
                  iVar6 = (*(code *)_buf[1].base)(_buf);
                }
              }
            }
          }
        }
      }
    }
  }
  emit_certificate._4_4_ = iVar6;
  return emit_certificate._4_4_;
}

Assistant:

static int send_certificate_and_certificate_verify(ptls_t *tls, ptls_message_emitter_t *emitter,
                                                   struct st_ptls_signature_algorithms_t *signature_algorithms,
                                                   ptls_iovec_t context, const char *context_string, int push_status_request,
                                                   const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    if (signature_algorithms->count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    { /* send Certificate (or the equivalent) */
        static ptls_emit_certificate_t default_emit_certificate = {default_emit_certificate_cb};
        ptls_emit_certificate_t *emit_certificate =
            tls->ctx->emit_certificate != NULL ? tls->ctx->emit_certificate : &default_emit_certificate;
    Redo:
        if ((ret = emit_certificate->cb(emit_certificate, tls, emitter, tls->key_schedule, context, push_status_request,
                                        compress_algos, num_compress_algos)) != 0) {
            if (ret == PTLS_ERROR_DELEGATE) {
                assert(emit_certificate != &default_emit_certificate);
                emit_certificate = &default_emit_certificate;
                goto Redo;
            }
            goto Exit;
        }
    }

    /* build and send CertificateVerify */
    if (tls->ctx->sign_certificate != NULL) {
        ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_CERTIFICATE_VERIFY, {
            ptls_buffer_t *sendbuf = emitter->buf;
            size_t algo_off = sendbuf->off;
            ptls_buffer_push16(sendbuf, 0); /* filled in later */
            ptls_buffer_push_block(sendbuf, 2, {
                uint16_t algo;
                uint8_t data[PTLS_MAX_CERTIFICATE_VERIFY_SIGNDATA_SIZE];
                size_t datalen = build_certificate_verify_signdata(data, tls->key_schedule, context_string);
                if ((ret = tls->ctx->sign_certificate->cb(tls->ctx->sign_certificate, tls, &algo, sendbuf,
                                                          ptls_iovec_init(data, datalen), signature_algorithms->list,
                                                          signature_algorithms->count)) != 0) {
                    goto Exit;
                }
                sendbuf->base[algo_off] = (uint8_t)(algo >> 8);
                sendbuf->base[algo_off + 1] = (uint8_t)algo;
            });
        });
    }

Exit:
    return ret;
}